

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strcmp.c
# Opt level: O0

int strcmp(char *__s1,char *__s2)

{
  bool bVar1;
  byte *local_18;
  char *s2_local;
  char *s1_local;
  
  local_18 = (byte *)__s2;
  s2_local = __s1;
  while( true ) {
    bVar1 = false;
    if (*s2_local != '\0') {
      bVar1 = *s2_local == *local_18;
    }
    if (!bVar1) break;
    s2_local = s2_local + 1;
    local_18 = local_18 + 1;
  }
  return (uint)(byte)*s2_local - (uint)*local_18;
}

Assistant:

int strcmp( const char * s1, const char * s2 )
{
    while ( ( *s1 ) && ( *s1 == *s2 ) )
    {
        ++s1;
        ++s2;
    }

    return ( *( unsigned char * )s1 - * ( unsigned char * )s2 );
}